

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O2

void __thiscall FZFile::decode(FZFile *this,char *source,size_t size)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t pos;
  size_t sVar12;
  uint uVar13;
  long lVar14;
  undefined1 uStack_39;
  undefined8 local_38;
  undefined8 uStack_30;
  uint8_t ibuf [16];
  
  local_38 = 0;
  uStack_30 = 0;
  uVar10 = 0;
  local_38._4_4_ = 0;
  local_38._0_4_ = 0;
  uVar9 = 0;
  for (sVar12 = 0; sVar12 != size; sVar12 = sVar12 + 1) {
    uVar11 = local_38._4_4_ + (this->key)._M_elems[0];
    uVar10 = uVar10 + (this->key)._M_elems[1];
    uVar13 = (uint)local_38;
    for (lVar14 = 0; uVar8 = uVar10, uVar7 = uVar11, lVar14 != 0x14; lVar14 = lVar14 + 1) {
      uVar10 = (uVar7 * 2 + 1) * uVar7;
      uVar11 = uVar10 * 0x20 | uVar10 >> 0x1b;
      uVar10 = (uVar8 * 2 + 1) * uVar8;
      uVar10 = uVar10 * 0x20 | uVar10 >> 0x1b;
      uVar13 = uVar13 ^ uVar11;
      bVar1 = (byte)uVar10 & 0x1f;
      uVar10 = uVar10 ^ uVar9;
      bVar2 = (byte)uVar11 & 0x1f;
      lVar3 = lVar14 * 2;
      lVar4 = lVar14 * 2;
      uVar11 = (uVar10 << bVar2 | uVar10 >> 0x20 - bVar2) + (this->key)._M_elems[lVar4 + 3];
      uVar10 = (uVar13 << bVar1 | uVar13 >> 0x20 - bVar1) + (this->key)._M_elems[lVar3 + 2];
      uVar9 = uVar8;
      uVar13 = uVar7;
    }
    bVar1 = source[sVar12];
    source[sVar12] = (char)uVar13 + (char)(this->key)._M_elems[0x2a] ^ bVar1;
    for (lVar14 = 1; uVar5 = uStack_30, lVar14 != 0x10; lVar14 = lVar14 + 1) {
      (&uStack_39)[lVar14] = *(undefined1 *)((long)&local_38 + lVar14);
    }
    uStack_30 = CONCAT17(bVar1,(undefined7)uStack_30);
    uVar6 = uStack_30;
    uStack_30._0_4_ = (uint)uVar5;
    uStack_30._4_2_ = SUB82(uVar5,4);
    uStack_30._6_1_ = SUB81(uVar5,6);
    uVar10 = (uint)bVar1 << 0x18 | (uint)uStack_30._4_2_ | (uint)uStack_30._6_1_ << 0x10;
    uVar9 = (uint)uStack_30;
    uStack_30 = uVar6;
  }
  return;
}

Assistant:

void FZFile::decode(char *source, size_t size) const {
	// Along the lines of http://people.csail.mit.edu/rivest/pubs/RRSY98.pdf
	// (page 3, 2.2)
	int32_t logw = 5;
	uint32_t r   = 20;

	uint32_t A = 0;
	uint32_t B = 0;
	uint32_t C = 0;
	uint32_t D = 0;

	uint8_t currentByte;
	uint8_t ibuf[16] = {0}; // you'll see

	// RC6 algo from the paper, basically 1:1
	for (size_t pos = 0; pos < size; ++pos) {
		B = B + key[0];
		D = D + key[1];
		for (uint32_t i = 1; i < (r + 1); ++i) { // loop offset by 1
			uint32_t t = rotl32(B * (2 * B + 1), logw);
			uint32_t u = rotl32(D * (2 * D + 1), logw);
			A          = rotl32(A ^ t, u) + key[2 * i];
			C          = rotl32(C ^ u, t) + key[2 * i + 1];

			uint32_t tmp = A;
			A            = B;
			B            = C;
			C            = D;
			D            = tmp;
		}
		A = A + key[2 * r + 2];
		C = C + key[2 * r + 3]; // not used I guess

		// rolling over the the uint8_t string
		// buf[pos] xor A -> is our resulting byte
		currentByte = source[pos];
		source[pos] = ((uint8_t)(currentByte ^ (A & 0xFF)));
		// fprintf(stdout,"%c",source[pos]);

		// pushing in a stream of buf[pos] chars 'from the right'
		// and shift whole array 8 bits to the left
		for (uint32_t i = 0; i < 15; ++i) {
			ibuf[i] = ibuf[i + 1];
		}
		ibuf[15] = currentByte;

		// align 4 consequent int32s to that buffer
		// (A, B, C, D) = (buf[0], buf[1], buf[2], buf[3])
		// byte order?!
		A = ibuf[0] | ibuf[1] << 8 | ibuf[2] << 16 | ibuf[3] << 24;
		B = ibuf[4] | ibuf[5] << 8 | ibuf[6] << 16 | ibuf[7] << 24;
		C = ibuf[8] | ibuf[9] << 8 | ibuf[10] << 16 | ibuf[11] << 24;
		D = ibuf[12] | ibuf[13] << 8 | ibuf[14] << 16 | ibuf[15] << 24;
	}
}